

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool llvm::sys::path::has_relative_path(Twine *path,Style style)

{
  Style in_ECX;
  StringRef SVar1;
  size_t local_c8;
  path *local_c0;
  StringRef p;
  SmallString<128U> path_storage;
  Style style_local;
  Twine *path_local;
  
  SmallString<128U>::SmallString((SmallString<128U> *)&p.Length);
  SVar1 = Twine::toStringRef(path,(SmallVectorImpl<char> *)&p.Length);
  local_c0 = (path *)SVar1.Data;
  p.Data = (char *)SVar1.Length;
  SVar1.Length._0_4_ = style;
  SVar1.Data = p.Data;
  SVar1.Length._4_4_ = 0;
  SVar1 = relative_path(local_c0,SVar1,in_ECX);
  local_c8 = SVar1.Length;
  SmallString<128U>::~SmallString((SmallString<128U> *)&p.Length);
  return (bool)((local_c8 == 0 ^ 0xffU) & 1);
}

Assistant:

bool has_relative_path(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !relative_path(p, style).empty();
}